

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coap.cpp
# Opt level: O0

string * __thiscall
ot::commissioner::coap::CodeToString_abi_cxx11_
          (string *__return_storage_ptr__,coap *this,Code aCode)

{
  undefined1 local_38 [8];
  string str;
  Code aCode_local;
  
  str.field_2._M_local_buf[0xf] = (char)this;
  std::__cxx11::string::string((string *)local_38);
  switch(str.field_2._M_local_buf[0xf]) {
  case '\0':
    std::__cxx11::string::operator=((string *)local_38,"EMPTY");
    break;
  case '\x01':
    std::__cxx11::string::operator=((string *)local_38,"GET");
    break;
  case '\x02':
    std::__cxx11::string::operator=((string *)local_38,"POST");
    break;
  case '\x03':
    std::__cxx11::string::operator=((string *)local_38,"PUT");
    break;
  case '\x04':
    std::__cxx11::string::operator=((string *)local_38,"DELETE");
    break;
  case 'A':
    std::__cxx11::string::operator=((string *)local_38,"CREATED");
    break;
  case 'B':
    std::__cxx11::string::operator=((string *)local_38,"DELETED");
    break;
  case 'C':
    std::__cxx11::string::operator=((string *)local_38,"VALID");
    break;
  case 'D':
    std::__cxx11::string::operator=((string *)local_38,"CHANGED");
    break;
  case 'E':
    std::__cxx11::string::operator=((string *)local_38,"CONTENT");
    break;
  case -0x80:
    std::__cxx11::string::operator=((string *)local_38,"BAD_REQUEST");
    break;
  case -0x7f:
    std::__cxx11::string::operator=((string *)local_38,"UNAUTHORIZED");
    break;
  case -0x7e:
    std::__cxx11::string::operator=((string *)local_38,"BAD_OPTION");
    break;
  case -0x7d:
    std::__cxx11::string::operator=((string *)local_38,"FORBIDDEN");
    break;
  case -0x7c:
    std::__cxx11::string::operator=((string *)local_38,"NOT_FOUND");
    break;
  case -0x7b:
    std::__cxx11::string::operator=((string *)local_38,"METHOD_NOT_ALLOWED");
    break;
  case -0x7a:
    std::__cxx11::string::operator=((string *)local_38,"NOT_ACCEPTABLE");
    break;
  default:
    std::__cxx11::string::operator=((string *)local_38,"UNKNOWN");
    break;
  case -0x74:
    std::__cxx11::string::operator=((string *)local_38,"PRECONDITIONFAILED");
    break;
  case -0x73:
    std::__cxx11::string::operator=((string *)local_38,"REQUEST_TOOL_LARGE");
    break;
  case -0x71:
    std::__cxx11::string::operator=((string *)local_38,"UNSUPPORTED_FORMAT");
    break;
  case -0x60:
    std::__cxx11::string::operator=((string *)local_38,"INTERNAL_ERROR");
    break;
  case -0x5f:
    std::__cxx11::string::operator=((string *)local_38,"NOT_IMPLEMENTED");
    break;
  case -0x5e:
    std::__cxx11::string::operator=((string *)local_38,"BAD_GATEWAY");
    break;
  case -0x5d:
    std::__cxx11::string::operator=((string *)local_38,"SERVICE_UNAVAILABLE");
    break;
  case -0x5c:
    std::__cxx11::string::operator=((string *)local_38,"BATEWAY_TIMEOUT");
    break;
  case -0x5b:
    std::__cxx11::string::operator=((string *)local_38,"PROXY_NOT_SUPPORTED");
  }
  std::operator+(__return_storage_ptr__,"CoAP::",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38);
  std::__cxx11::string::~string((string *)local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string CodeToString(Code aCode)
{
    std::string str;

    switch (aCode)
    {
    /*
     * Methods (0.XX).
     */
    case Code::kEmpty:
        str = "EMPTY";
        break;
    case Code::kGet:
        str = "GET";
        break;
    case Code::kPost:
        str = "POST";
        break;

    case Code::kPut:
        str = "PUT";
        break;

    case Code::kDelete:
        str = "DELETE";
        break;

    /*
     * Success (2.XX).
     */
    case Code::kCreated:
        str = "CREATED";
        break;
    case Code::kDeleted:
        str = "DELETED";
        break;
    case Code::kValid:
        str = "VALID";
        break;
    case Code::kChanged:
        str = "CHANGED";
        break;
    case Code::kContent:
        str = "CONTENT";
        break;

    /*
     * Client side errors (4.XX).
     */
    case Code::kBadRequest:
        str = "BAD_REQUEST";
        break;
    case Code::kUnauthorized:
        str = "UNAUTHORIZED";
        break;
    case Code::kBadOption:
        str = "BAD_OPTION";
        break;
    case Code::kForBidden:
        str = "FORBIDDEN";
        break;
    case Code::kNotFound:
        str = "NOT_FOUND";
        break;
    case Code::kMethodNotAllowed:
        str = "METHOD_NOT_ALLOWED";
        break;
    case Code::kNotAcceptable:
        str = "NOT_ACCEPTABLE";
        break;
    case Code::kPreconditionFailed:
        str = "PRECONDITIONFAILED";
        break;
    case Code::kRequestTooLarge:
        str = "REQUEST_TOOL_LARGE";
        break;
    case Code::kUnsupportedFormat:
        str = "UNSUPPORTED_FORMAT";
        break;

    /*
     * Server side errors (5.XX).
     */
    case Code::kInternalError:
        str = "INTERNAL_ERROR";
        break;
    case Code::kNotImplemented:
        str = "NOT_IMPLEMENTED";
        break;
    case Code::kBadGateway:
        str = "BAD_GATEWAY";
        break;
    case Code::kServiceUnavailable:
        str = "SERVICE_UNAVAILABLE";
        break;
    case Code::kGatewayTimeout:
        str = "BATEWAY_TIMEOUT";
        break;
    case Code::kProxyNotSupported:
        str = "PROXY_NOT_SUPPORTED";
        break;
    default:
        str = "UNKNOWN";
        break;
    }

    return "CoAP::" + str;
}